

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

bool __thiscall
robin_hood::detail::
Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
try_increase_info(Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                  *this)

{
  size_t sVar1;
  unsigned_long uVar2;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *in_RDI;
  unsigned_long val;
  size_t i;
  size_t numElementsWithBuffer;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
  *in_stack_ffffffffffffffd8;
  ulong local_20;
  size_t in_stack_ffffffffffffffe8;
  bool local_1;
  
  if (in_RDI->mInfoInc < 3) {
    local_1 = false;
  }
  else {
    in_RDI->mInfoInc = in_RDI->mInfoInc >> 1 & 0xff;
    in_RDI->mInfoHashShift = in_RDI->mInfoHashShift + 1;
    sVar1 = calcNumElementsWithBuffer(in_RDI,in_stack_ffffffffffffffe8);
    for (local_20 = 0; local_20 < sVar1; local_20 = local_20 + 8) {
      uVar2 = unaligned_load<unsigned_long>(in_RDI->mInfo + local_20);
      in_stack_ffffffffffffffd8 =
           (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *)
           (uVar2 >> 1 & 0x7f7f7f7f7f7f7f7f);
      *(Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> **)
       (in_RDI->mInfo + local_20) = in_stack_ffffffffffffffd8;
    }
    in_RDI->mInfo[sVar1] = '\x01';
    sVar1 = calcMaxNumElementsAllowed(in_stack_ffffffffffffffd8,(size_t)in_RDI);
    in_RDI->mMaxNumElementsAllowed = sVar1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool try_increase_info() {
        ROBIN_HOOD_LOG("mInfoInc=" << mInfoInc << ", numElements=" << mNumElements
                                   << ", maxNumElementsAllowed="
                                   << calcMaxNumElementsAllowed(mMask + 1))
        if (mInfoInc <= 2) {
            // need to be > 2 so that shift works (otherwise undefined behavior!)
            return false;
        }
        // we got space left, try to make info smaller
        mInfoInc = static_cast<uint8_t>(mInfoInc >> 1U);

        // remove one bit of the hash, leaving more space for the distance info.
        // This is extremely fast because we can operate on 8 bytes at once.
        ++mInfoHashShift;
        auto const numElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        for (size_t i = 0; i < numElementsWithBuffer; i += 8) {
            auto val = unaligned_load<uint64_t>(mInfo + i);
            val = (val >> 1U) & UINT64_C(0x7f7f7f7f7f7f7f7f);
            std::memcpy(mInfo + i, &val, sizeof(val));
        }
        // update sentinel, which might have been cleared out!
        mInfo[numElementsWithBuffer] = 1;

        mMaxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        return true;
    }